

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

basic_value<toml::discard_comments,_std::unordered_map,_std::vector> * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  value_t vVar1;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v_local;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this_local;
  
  if (this != v) {
    cleanup(this,(EVP_PKEY_CTX *)v);
    std::shared_ptr<toml::detail::region_base>::operator=(&this->region_info_,&v->region_info_);
    vVar1 = type(v);
    this->type_ = vVar1;
    switch(this->type_) {
    case boolean:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::assigner<bool,bool_const&>
                (&(this->field_1).boolean_,&(v->field_1).boolean_);
      break;
    case integer:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::assigner<long,long_const&>
                (&(this->field_1).integer_,&(v->field_1).integer_);
      break;
    case floating:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<double,double_const&>(&(this->field_1).floating_,&(v->field_1).floating_);
      break;
    case string:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::string,toml::string_const&>(&(this->field_1).string_,&(v->field_1).string_);
      break;
    case offset_datetime:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::offset_datetime,toml::offset_datetime_const&>
                (&(this->field_1).offset_datetime_,&(v->field_1).offset_datetime_);
      break;
    case local_datetime:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::local_datetime,toml::local_datetime_const&>
                (&(this->field_1).local_datetime_,&(v->field_1).local_datetime_);
      break;
    case local_date:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::local_date,toml::local_date_const&>
                (&(this->field_1).local_date_,&(v->field_1).local_date_);
      break;
    case local_time:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::local_time,toml::local_time_const&>
                (&(this->field_1).local_time_,&(v->field_1).local_time_);
      break;
    case array:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::detail::storage<std::vector<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::allocator<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>,toml::detail::storage<std::vector<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::allocator<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>const&>
                ((storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                  *)&(this->field_1).string_,
                 (storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                  *)&(v->field_1).string_);
      break;
    case table:
      basic_value<toml::discard_comments,std::unordered_map,std::vector>::
      assigner<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>>,toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>>const&>
                ((storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                  *)&(this->field_1).string_,
                 (storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                  *)&(v->field_1).string_);
    }
  }
  return this;
}

Assistant:

basic_value& operator=(const basic_value& v)
    {
        if(this == std::addressof(v)) {return *this;}
        this->cleanup();
        this->region_info_ = v.region_info_;
        this->comments_ = v.comments_;
        this->type_ = v.type();
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default: break;
        }
        return *this;
    }